

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.h
# Opt level: O2

void __thiscall dlib::impl1::bsp_con::bsp_con(bsp_con *this,network_address *dest)

{
  _Head_base<0UL,_dlib::connection_*,_false> _Var1;
  int iVar2;
  undefined4 extraout_var;
  socklen_t in_EDX;
  
  iVar2 = connect((int)dest,(sockaddr *)dest,in_EDX);
  _Var1._M_head_impl._4_4_ = extraout_var;
  _Var1._M_head_impl._0_4_ = iVar2;
  (this->con)._M_t.super___uniq_ptr_impl<dlib::connection,_std::default_delete<dlib::connection>_>.
  _M_t.super__Tuple_impl<0UL,_dlib::connection_*,_std::default_delete<dlib::connection>_>.
  super__Head_base<0UL,_dlib::connection_*,_false>._M_head_impl = _Var1._M_head_impl;
  sockstreambuf::sockstreambuf(&this->buf,&this->con);
  std::iostream::iostream(&this->stream,&(this->buf).super_streambuf);
  this->terminated = false;
  connection::disable_nagle
            ((this->con)._M_t.
             super___uniq_ptr_impl<dlib::connection,_std::default_delete<dlib::connection>_>._M_t.
             super__Tuple_impl<0UL,_dlib::connection_*,_std::default_delete<dlib::connection>_>.
             super__Head_base<0UL,_dlib::connection_*,_false>._M_head_impl);
  return;
}

Assistant:

bsp_con(
                const network_address& dest
            ) : 
                con(connect(dest)),
                buf(con),
                stream(&buf),
                terminated(false)
            {
                con->disable_nagle();
            }